

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandExtSeqDcs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  uint local_38;
  int fVerbose;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Abc_FrameReadNtk(pAbc);
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  local_38 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar1 == -1) {
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        iVar1 = Abc_NtkLatchNum(pNtk_00);
        if (iVar1 == 0) {
          Abc_Print(-1,"The current network has no latches.\n");
          pAbc_local._4_4_ = 0;
        }
        else {
          iVar1 = Abc_NtkIsStrash(pNtk_00);
          if (iVar1 == 0) {
            Abc_Print(-1,
                      "Extracting sequential don\'t-cares works only for AIGs (run \"strash\").\n");
            pAbc_local._4_4_ = 0;
          }
          else {
            iVar1 = Abc_NtkExtractSequentialDcs(pNtk_00,local_38);
            if (iVar1 == 0) {
              Abc_Print(-1,"Extracting sequential don\'t-cares has failed.\n");
              pAbc_local._4_4_ = 1;
            }
            else {
              pAbc_local._4_4_ = 0;
            }
          }
        }
      }
      return pAbc_local._4_4_;
    }
    if ((iVar1 == 0x68) || (iVar1 != 0x76)) break;
    local_38 = local_38 ^ 1;
  }
  Abc_Print(-2,"usage: ext_seq_dcs [-vh]\n");
  Abc_Print(-2,"\t         create EXDC network using unreachable states\n");
  pcVar2 = "no";
  if (local_38 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandExtSeqDcs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fVerbose;
    extern int Abc_NtkExtractSequentialDcs( Abc_Ntk_t * pNet, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkLatchNum(pNtk) == 0 )
    {
        Abc_Print( -1, "The current network has no latches.\n" );
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Extracting sequential don't-cares works only for AIGs (run \"strash\").\n" );
        return 0;
    }
    if ( !Abc_NtkExtractSequentialDcs( pNtk, fVerbose ) )
    {
        Abc_Print( -1, "Extracting sequential don't-cares has failed.\n" );
        return 1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: ext_seq_dcs [-vh]\n" );
    Abc_Print( -2, "\t         create EXDC network using unreachable states\n" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}